

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

scalar __thiscall
absl::
make_unique<s2builderutil::NormalizeClosedSetImpl::DimensionLayer,int&,S2Builder::GraphOptions_const&,std::shared_ptr<s2builderutil::NormalizeClosedSetImpl>&>
          (absl *this,int *args,GraphOptions *args_1,
          shared_ptr<s2builderutil::NormalizeClosedSetImpl> *args_2)

{
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 *puVar5;
  
  puVar5 = (undefined8 *)operator_new(0x30);
  iVar1 = *args;
  peVar2 = (args_2->
           super___shared_ptr<s2builderutil::NormalizeClosedSetImpl,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var3 = (args_2->
           super___shared_ptr<s2builderutil::NormalizeClosedSetImpl,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  *puVar5 = &PTR__DimensionLayer_002bb3e8;
  *(int *)(puVar5 + 1) = iVar1;
  uVar4 = *(undefined8 *)&args_1->duplicate_edges_;
  *(undefined8 *)((long)puVar5 + 0xc) = *(undefined8 *)args_1;
  *(undefined8 *)((long)puVar5 + 0x14) = uVar4;
  *(undefined4 *)((long)puVar5 + 0x1c) = *(undefined4 *)&args_1->allow_vertex_filtering_;
  puVar5[4] = peVar2;
  puVar5[5] = p_Var3;
  *(undefined8 **)this = puVar5;
  return (__uniq_ptr_data<s2builderutil::NormalizeClosedSetImpl::DimensionLayer,_std::default_delete<s2builderutil::NormalizeClosedSetImpl::DimensionLayer>,_true,_true>
          )(__uniq_ptr_data<s2builderutil::NormalizeClosedSetImpl::DimensionLayer,_std::default_delete<s2builderutil::NormalizeClosedSetImpl::DimensionLayer>,_true,_true>
            )this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}